

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_bde.c
# Opt level: O2

void beltBDEStepE(void *buf,size_t count,void *state)

{
  for (; 0xf < count; count = count - 0x10) {
    beltBlockMulC((u32 *)((long)state + 0x20));
    u32To((void *)((long)state + 0x30),0x10,(u32 *)((long)state + 0x20));
    *(ulong *)buf = *buf ^ *(ulong *)((long)state + 0x30);
    *(ulong *)((long)buf + 8) = *(ulong *)((long)buf + 8) ^ *(ulong *)((long)state + 0x38);
    beltBlockEncr((octet *)buf,(u32 *)state);
    *(ulong *)buf = *buf ^ *(ulong *)((long)state + 0x30);
    *(ulong *)((long)buf + 8) = *(ulong *)((long)buf + 8) ^ *(ulong *)((long)state + 0x38);
    buf = (void *)((long)buf + 0x10);
  }
  return;
}

Assistant:

void beltBDEStepE(void* buf, size_t count, void* state)
{
	belt_bde_st* st = (belt_bde_st*)state;
	ASSERT(count % 16 == 0);
	ASSERT(memIsDisjoint2(buf, count, state, beltBDE_keep()));
	// цикл по блокам
	while(count >= 16)
	{
		beltBlockMulC(st->s);
		u32To(st->block, 16, st->s);
		beltBlockXor2(buf, st->block);
		beltBlockEncr(buf, st->key);
		beltBlockXor2(buf, st->block);
		buf = (octet*)buf + 16;
		count -= 16;
	}
}